

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::~PosixSequentialFile(PosixSequentialFile *this)

{
  PosixSequentialFile *this_local;
  
  close(this->fd_);
  std::__cxx11::string::~string((string *)&this->filename_);
  SequentialFile::~SequentialFile(&this->super_SequentialFile);
  return;
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status status;
    while (true) {
      ::ssize_t read_size = ::read(fd_, scratch, n);
      if (read_size < 0) {  // Read error.
        if (errno == EINTR) {
          continue;  // Retry
        }
        status = PosixError(filename_, errno);
        break;
      }
      *result = Slice(scratch, read_size);
      break;
    }
    return status;
  }